

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

int __thiscall QTableView::sizeHintForColumn(QTableView *this,int column)

{
  QPersistentModelIndex *this_00;
  long lVar1;
  QTableViewPrivate *this_01;
  QWidgetData *pQVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QAbstractItemModel *pQVar7;
  int visualIndex;
  int iVar8;
  int iVar9;
  long in_FS_OFFSET;
  int local_174;
  QModelIndex local_158;
  QModelIndex local_140;
  QModelIndex local_128;
  QStyleOptionViewItem option;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QTableViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  pQVar7 = QAbstractItemView::model((QAbstractItemView *)this);
  if (pQVar7 == (QAbstractItemModel *)0x0) {
    local_174 = -1;
  }
  else {
    QWidget::ensurePolished((QWidget *)this);
    iVar4 = QHeaderView::resizeContentsPrecision(this_01->horizontalHeader);
    iVar5 = QHeaderView::visualIndexAt(this_01->verticalHeader,0);
    visualIndex = 0;
    if (0 < iVar5) {
      visualIndex = iVar5;
    }
    pQVar2 = ((this_01->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    iVar5 = QHeaderView::visualIndexAt
                      (this_01->verticalHeader,((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i) + 1
                      );
    if ((iVar5 == -1) ||
       ((((this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.data)
         ->widget_attributes & 0x8000) == 0)) {
      pQVar7 = (this_01->super_QAbstractItemViewPrivate).model;
      QPersistentModelIndex::operator_cast_to_QModelIndex
                ((QModelIndex *)&option,&(this_01->super_QAbstractItemViewPrivate).root);
      iVar5 = (**(code **)(*(long *)pQVar7 + 0x78))(pQVar7,&option);
      iVar5 = iVar5 + -1;
    }
    memset(&option,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem(&option);
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x2f8))(this,&option);
    local_128.r = -1;
    local_128.c = -1;
    local_128.i = 0;
    local_128.m.ptr = (QAbstractItemModel *)0x0;
    this_00 = &(this_01->super_QAbstractItemViewPrivate).root;
    iVar8 = 0;
    local_174 = 0;
    for (iVar9 = visualIndex; iVar6 = iVar8, iVar9 <= iVar5; iVar9 = iVar9 + 1) {
      iVar6 = QHeaderView::logicalIndex(this_01->verticalHeader,iVar9);
      bVar3 = QHeaderView::isSectionHidden(this_01->verticalHeader,iVar6);
      if (!bVar3) {
        pQVar7 = (this_01->super_QAbstractItemViewPrivate).model;
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_158,this_00);
        (**(code **)(*(long *)pQVar7 + 0x60))(&local_140,pQVar7,iVar6,column,&local_158);
        local_128.m.ptr = local_140.m.ptr;
        local_128.r = local_140.r;
        local_128.c = local_140.c;
        local_128.i = local_140.i;
        local_174 = QTableViewPrivate::widthHintForIndex(this_01,&local_128,local_174,&option);
        iVar8 = iVar8 + 1;
        iVar6 = iVar4;
        if (iVar8 == iVar4) break;
      }
    }
    pQVar7 = (this_01->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_140,this_00);
    iVar5 = (**(code **)(*(long *)pQVar7 + 0x78))(pQVar7,&local_140);
    iVar9 = iVar9 + -1;
    if (iVar5 <= visualIndex) {
      iVar6 = iVar4;
    }
    if (iVar4 == 0) {
      iVar6 = iVar4;
    }
    iVar5 = iVar5 + -1;
    while ((iVar6 != iVar4 && ((0 < visualIndex || (iVar9 < iVar5))))) {
      if ((((byte)iVar6 & 0 < visualIndex) == 0) && (iVar9 != iVar5)) {
        do {
          if (iVar5 <= iVar9) goto LAB_0052df53;
          iVar9 = iVar9 + 1;
          iVar8 = QHeaderView::logicalIndex(this_01->verticalHeader,iVar9);
          bVar3 = QHeaderView::isSectionHidden(this_01->verticalHeader,iVar8);
        } while (bVar3);
      }
      else {
        do {
          if (visualIndex < 1) goto LAB_0052df53;
          visualIndex = visualIndex + -1;
          iVar8 = QHeaderView::logicalIndex(this_01->verticalHeader,visualIndex);
          bVar3 = QHeaderView::isSectionHidden(this_01->verticalHeader,iVar8);
        } while (bVar3);
      }
      if (-1 < iVar8) {
        pQVar7 = (this_01->super_QAbstractItemViewPrivate).model;
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_158,this_00);
        (**(code **)(*(long *)pQVar7 + 0x60))(&local_140,pQVar7,iVar8,column,&local_158);
        local_128.m.ptr = local_140.m.ptr;
        local_128.r = local_140.r;
        local_128.c = local_140.c;
        local_128.i = local_140.i;
        local_174 = QTableViewPrivate::widthHintForIndex(this_01,&local_128,local_174,&option);
      }
LAB_0052df53:
      iVar6 = iVar6 + 1;
    }
    local_174 = local_174 + (uint)this_01->showGrid;
    QStyleOptionViewItem::~QStyleOptionViewItem(&option);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_174;
}

Assistant:

int QTableView::sizeHintForColumn(int column) const
{
    Q_D(const QTableView);

    if (!model())
        return -1;

    ensurePolished();
    const int maximumProcessRows = d->horizontalHeader->resizeContentsPrecision();

    int top = qMax(0, d->verticalHeader->visualIndexAt(0));
    int bottom = d->verticalHeader->visualIndexAt(d->viewport->height());
    if (!isVisible() || bottom == -1) // the table don't have enough rows to fill the viewport
        bottom = d->model->rowCount(d->root) - 1;

    QStyleOptionViewItem option;
    initViewItemOption(&option);

    int hint = 0;
    int rowsProcessed = 0;
    QModelIndex index;
    int row = top;
    for (; row <= bottom; ++row) {
        int logicalRow = d->verticalHeader->logicalIndex(row);
        if (d->verticalHeader->isSectionHidden(logicalRow))
            continue;
        index = d->model->index(logicalRow, column, d->root);

        hint = d->widthHintForIndex(index, hint, option);
        ++rowsProcessed;
        if (rowsProcessed == maximumProcessRows)
            break;
    }

    const int actualBottom = d->model->rowCount(d->root) - 1;
    int idxTop = top;
    int idxBottom = row - 1;

    if (maximumProcessRows == 0 || actualBottom < idxTop)
        rowsProcessed = maximumProcessRows;  // skip the while loop

    while (rowsProcessed != maximumProcessRows && (idxTop > 0 || idxBottom < actualBottom)) {
        int logicalIdx  = -1;

        if ((rowsProcessed % 2 && idxTop > 0) || idxBottom == actualBottom) {
            while (idxTop > 0) {
                --idxTop;
                int logrow = d->verticalHeader->logicalIndex(idxTop);
                if (d->verticalHeader->isSectionHidden(logrow))
                    continue;
                logicalIdx = logrow;
                break;
            }
        } else {
            while (idxBottom < actualBottom) {
                ++idxBottom;
                int logrow = d->verticalHeader->logicalIndex(idxBottom);
                if (d->verticalHeader->isSectionHidden(logrow))
                    continue;
                logicalIdx = logrow;
                break;
            }
        }
        if (logicalIdx >= 0) {
            index = d->model->index(logicalIdx, column, d->root);
            hint = d->widthHintForIndex(index, hint, option);
        }
        ++rowsProcessed;
    }

    return d->showGrid ? hint + 1 : hint;
}